

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# belt_block.c
# Opt level: O2

void beltBlockEncr(octet *block,u32 *key)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  
  uVar4 = *key + *(int *)block;
  uVar7 = H13[uVar4 >> 8 & 0xff] ^ H5[uVar4 & 0xff] ^
          *(uint *)((long)H21 + (ulong)(uVar4 >> 0xe & 0x3fc)) ^ H29[uVar4 >> 0x18] ^
          *(uint *)(block + 4);
  *(uint *)(block + 4) = uVar7;
  uVar4 = key[1] + *(int *)(block + 0xc);
  uVar8 = H29[uVar4 >> 8 & 0xff] ^ H21[uVar4 & 0xff] ^
          *(uint *)((long)H5 + (ulong)(uVar4 >> 0xe & 0x3fc)) ^ H13[uVar4 >> 0x18] ^
          *(uint *)(block + 8);
  *(uint *)(block + 8) = uVar8;
  uVar4 = key[2] + uVar7;
  uVar1 = *(int *)block -
          (H21[uVar4 >> 8 & 0xff] ^ H13[uVar4 & 0xff] ^
           *(uint *)((long)H29 + (ulong)(uVar4 >> 0xe & 0x3fc)) ^ H5[uVar4 >> 0x18]);
  *(uint *)block = uVar1;
  *(uint *)(block + 8) = uVar8 + uVar7;
  uVar4 = uVar8 + uVar7 + key[3];
  uVar4 = H21[uVar4 & 0xff] ^ H29[uVar4 >> 8 & 0xff] ^
          *(uint *)((long)H5 + (ulong)(uVar4 >> 0xe & 0x3fc)) ^ H13[uVar4 >> 0x18] ^ 1;
  uVar7 = uVar7 + uVar4;
  *(uint *)(block + 4) = uVar7;
  uVar8 = uVar8 - uVar4;
  *(uint *)(block + 8) = uVar8;
  uVar4 = key[4] + uVar8;
  uVar6 = (H21[uVar4 >> 8 & 0xff] ^ H13[uVar4 & 0xff] ^
           *(uint *)((long)H29 + (ulong)(uVar4 >> 0xe & 0x3fc)) ^ H5[uVar4 >> 0x18]) +
          *(int *)(block + 0xc);
  *(uint *)(block + 0xc) = uVar6;
  uVar4 = key[5] + uVar1;
  uVar7 = H21[uVar4 & 0xff] ^ H29[uVar4 >> 8 & 0xff] ^
          *(uint *)((long)H5 + (ulong)(uVar4 >> 0xe & 0x3fc)) ^ H13[uVar4 >> 0x18] ^ uVar7;
  *(uint *)(block + 4) = uVar7;
  uVar4 = key[6] + uVar6;
  uVar8 = H5[uVar4 & 0xff] ^ H13[uVar4 >> 8 & 0xff] ^
          *(uint *)((long)H21 + (ulong)(uVar4 >> 0xe & 0x3fc)) ^ H29[uVar4 >> 0x18] ^ uVar8;
  *(uint *)(block + 8) = uVar8;
  uVar4 = key[7] + uVar7;
  uVar6 = H5[uVar4 & 0xff] ^ H13[uVar4 >> 8 & 0xff] ^
          *(uint *)((long)H21 + (ulong)(uVar4 >> 0xe & 0x3fc)) ^ H29[uVar4 >> 0x18] ^ uVar6;
  *(uint *)(block + 0xc) = uVar6;
  uVar4 = *key + uVar8;
  uVar1 = H21[uVar4 & 0xff] ^ H29[uVar4 >> 8 & 0xff] ^
          *(uint *)((long)H5 + (ulong)(uVar4 >> 0xe & 0x3fc)) ^ H13[uVar4 >> 0x18] ^ uVar1;
  *(uint *)block = uVar1;
  uVar4 = key[1] + uVar6;
  uVar7 = uVar7 - (H21[uVar4 >> 8 & 0xff] ^ H13[uVar4 & 0xff] ^
                   *(uint *)((long)H29 + (ulong)(uVar4 >> 0xe & 0x3fc)) ^ H5[uVar4 >> 0x18]);
  *(uint *)(block + 4) = uVar7;
  *(uint *)block = uVar1 + uVar6;
  uVar4 = uVar1 + uVar6 + key[2];
  uVar4 = H21[uVar4 & 0xff] ^ H29[uVar4 >> 8 & 0xff] ^
          *(uint *)((long)H5 + (ulong)(uVar4 >> 0xe & 0x3fc)) ^ H13[uVar4 >> 0x18] ^ 2;
  uVar6 = uVar6 + uVar4;
  *(uint *)(block + 0xc) = uVar6;
  uVar1 = uVar1 - uVar4;
  *(uint *)block = uVar1;
  uVar4 = key[3] + uVar1;
  uVar8 = (H21[uVar4 >> 8 & 0xff] ^ H13[uVar4 & 0xff] ^
           *(uint *)((long)H29 + (ulong)(uVar4 >> 0xe & 0x3fc)) ^ H5[uVar4 >> 0x18]) + uVar8;
  *(uint *)(block + 8) = uVar8;
  uVar4 = key[4] + uVar7;
  uVar6 = H21[uVar4 & 0xff] ^ H29[uVar4 >> 8 & 0xff] ^
          *(uint *)((long)H5 + (ulong)(uVar4 >> 0xe & 0x3fc)) ^ H13[uVar4 >> 0x18] ^ uVar6;
  *(uint *)(block + 0xc) = uVar6;
  uVar4 = key[5] + uVar8;
  uVar1 = H5[uVar4 & 0xff] ^ H13[uVar4 >> 8 & 0xff] ^
          *(uint *)((long)H21 + (ulong)(uVar4 >> 0xe & 0x3fc)) ^ H29[uVar4 >> 0x18] ^ uVar1;
  *(uint *)block = uVar1;
  uVar4 = key[6] + uVar6;
  uVar8 = H5[uVar4 & 0xff] ^ H13[uVar4 >> 8 & 0xff] ^
          *(uint *)((long)H21 + (ulong)(uVar4 >> 0xe & 0x3fc)) ^ H29[uVar4 >> 0x18] ^ uVar8;
  *(uint *)(block + 8) = uVar8;
  uVar4 = key[7] + uVar1;
  uVar7 = H21[uVar4 & 0xff] ^ H29[uVar4 >> 8 & 0xff] ^
          *(uint *)((long)H5 + (ulong)(uVar4 >> 0xe & 0x3fc)) ^ H13[uVar4 >> 0x18] ^ uVar7;
  *(uint *)(block + 4) = uVar7;
  uVar4 = *key + uVar8;
  uVar6 = uVar6 - (H21[uVar4 >> 8 & 0xff] ^ H13[uVar4 & 0xff] ^
                   *(uint *)((long)H29 + (ulong)(uVar4 >> 0xe & 0x3fc)) ^ H5[uVar4 >> 0x18]);
  *(uint *)(block + 0xc) = uVar6;
  *(uint *)(block + 4) = uVar7 + uVar8;
  uVar4 = uVar7 + uVar8 + key[1];
  uVar4 = H21[uVar4 & 0xff] ^ H29[uVar4 >> 8 & 0xff] ^
          *(uint *)((long)H5 + (ulong)(uVar4 >> 0xe & 0x3fc)) ^ H13[uVar4 >> 0x18] ^ 3;
  uVar8 = uVar8 + uVar4;
  *(uint *)(block + 8) = uVar8;
  uVar7 = uVar7 - uVar4;
  *(uint *)(block + 4) = uVar7;
  uVar4 = key[2] + uVar7;
  uVar1 = (H21[uVar4 >> 8 & 0xff] ^ H13[uVar4 & 0xff] ^
           *(uint *)((long)H29 + (ulong)(uVar4 >> 0xe & 0x3fc)) ^ H5[uVar4 >> 0x18]) + uVar1;
  *(uint *)block = uVar1;
  uVar4 = key[3] + uVar6;
  uVar8 = H21[uVar4 & 0xff] ^ H29[uVar4 >> 8 & 0xff] ^
          *(uint *)((long)H5 + (ulong)(uVar4 >> 0xe & 0x3fc)) ^ H13[uVar4 >> 0x18] ^ uVar8;
  *(uint *)(block + 8) = uVar8;
  uVar4 = key[4] + uVar1;
  uVar7 = H5[uVar4 & 0xff] ^ H13[uVar4 >> 8 & 0xff] ^
          *(uint *)((long)H21 + (ulong)(uVar4 >> 0xe & 0x3fc)) ^ H29[uVar4 >> 0x18] ^ uVar7;
  *(uint *)(block + 4) = uVar7;
  uVar4 = key[5] + uVar8;
  uVar1 = H5[uVar4 & 0xff] ^ H13[uVar4 >> 8 & 0xff] ^
          *(uint *)((long)H21 + (ulong)(uVar4 >> 0xe & 0x3fc)) ^ H29[uVar4 >> 0x18] ^ uVar1;
  *(uint *)block = uVar1;
  uVar4 = key[6] + uVar7;
  uVar6 = H21[uVar4 & 0xff] ^ H29[uVar4 >> 8 & 0xff] ^
          *(uint *)((long)H5 + (ulong)(uVar4 >> 0xe & 0x3fc)) ^ H13[uVar4 >> 0x18] ^ uVar6;
  *(uint *)(block + 0xc) = uVar6;
  uVar4 = key[7] + uVar1;
  uVar8 = uVar8 - (H21[uVar4 >> 8 & 0xff] ^ H13[uVar4 & 0xff] ^
                   *(uint *)((long)H29 + (ulong)(uVar4 >> 0xe & 0x3fc)) ^ H5[uVar4 >> 0x18]);
  *(uint *)(block + 8) = uVar8;
  *(uint *)(block + 0xc) = uVar6 + uVar1;
  uVar4 = uVar6 + uVar1 + *key;
  uVar4 = H21[uVar4 & 0xff] ^ H29[uVar4 >> 8 & 0xff] ^
          *(uint *)((long)H5 + (ulong)(uVar4 >> 0xe & 0x3fc)) ^ H13[uVar4 >> 0x18] ^ 4;
  uVar1 = uVar1 + uVar4;
  *(uint *)block = uVar1;
  uVar6 = uVar6 - uVar4;
  *(uint *)(block + 0xc) = uVar6;
  uVar4 = key[1] + uVar6;
  uVar7 = (H21[uVar4 >> 8 & 0xff] ^ H13[uVar4 & 0xff] ^
           *(uint *)((long)H29 + (ulong)(uVar4 >> 0xe & 0x3fc)) ^ H5[uVar4 >> 0x18]) + uVar7;
  *(uint *)(block + 4) = uVar7;
  uVar4 = key[2] + uVar8;
  uVar1 = H21[uVar4 & 0xff] ^ H29[uVar4 >> 8 & 0xff] ^
          *(uint *)((long)H5 + (ulong)(uVar4 >> 0xe & 0x3fc)) ^ H13[uVar4 >> 0x18] ^ uVar1;
  *(uint *)block = uVar1;
  uVar4 = key[3] + uVar7;
  uVar6 = H5[uVar4 & 0xff] ^ H13[uVar4 >> 8 & 0xff] ^
          *(uint *)((long)H21 + (ulong)(uVar4 >> 0xe & 0x3fc)) ^ H29[uVar4 >> 0x18] ^ uVar6;
  *(uint *)(block + 0xc) = uVar6;
  uVar4 = key[4] + uVar1;
  uVar7 = H5[uVar4 & 0xff] ^ H13[uVar4 >> 8 & 0xff] ^
          *(uint *)((long)H21 + (ulong)(uVar4 >> 0xe & 0x3fc)) ^ H29[uVar4 >> 0x18] ^ uVar7;
  *(uint *)(block + 4) = uVar7;
  uVar4 = key[5] + uVar6;
  uVar8 = H21[uVar4 & 0xff] ^ H29[uVar4 >> 8 & 0xff] ^
          *(uint *)((long)H5 + (ulong)(uVar4 >> 0xe & 0x3fc)) ^ H13[uVar4 >> 0x18] ^ uVar8;
  *(uint *)(block + 8) = uVar8;
  uVar4 = key[6] + uVar7;
  uVar1 = uVar1 - (H21[uVar4 >> 8 & 0xff] ^ H13[uVar4 & 0xff] ^
                   *(uint *)((long)H29 + (ulong)(uVar4 >> 0xe & 0x3fc)) ^ H5[uVar4 >> 0x18]);
  *(uint *)block = uVar1;
  *(uint *)(block + 8) = uVar8 + uVar7;
  uVar4 = uVar8 + uVar7 + key[7];
  uVar4 = H21[uVar4 & 0xff] ^ H29[uVar4 >> 8 & 0xff] ^
          *(uint *)((long)H5 + (ulong)(uVar4 >> 0xe & 0x3fc)) ^ H13[uVar4 >> 0x18] ^ 5;
  uVar7 = uVar7 + uVar4;
  *(uint *)(block + 4) = uVar7;
  uVar8 = uVar8 - uVar4;
  *(uint *)(block + 8) = uVar8;
  uVar4 = *key + uVar8;
  uVar6 = (H21[uVar4 >> 8 & 0xff] ^ H13[uVar4 & 0xff] ^
           *(uint *)((long)H29 + (ulong)(uVar4 >> 0xe & 0x3fc)) ^ H5[uVar4 >> 0x18]) + uVar6;
  *(uint *)(block + 0xc) = uVar6;
  uVar4 = key[1] + uVar1;
  uVar7 = H21[uVar4 & 0xff] ^ H29[uVar4 >> 8 & 0xff] ^
          *(uint *)((long)H5 + (ulong)(uVar4 >> 0xe & 0x3fc)) ^ H13[uVar4 >> 0x18] ^ uVar7;
  *(uint *)(block + 4) = uVar7;
  uVar4 = key[2] + uVar6;
  uVar8 = H5[uVar4 & 0xff] ^ H13[uVar4 >> 8 & 0xff] ^
          *(uint *)((long)H21 + (ulong)(uVar4 >> 0xe & 0x3fc)) ^ H29[uVar4 >> 0x18] ^ uVar8;
  *(uint *)(block + 8) = uVar8;
  uVar4 = key[3] + uVar7;
  uVar6 = H5[uVar4 & 0xff] ^ H13[uVar4 >> 8 & 0xff] ^
          *(uint *)((long)H21 + (ulong)(uVar4 >> 0xe & 0x3fc)) ^ H29[uVar4 >> 0x18] ^ uVar6;
  *(uint *)(block + 0xc) = uVar6;
  uVar4 = key[4] + uVar8;
  uVar1 = H21[uVar4 & 0xff] ^ H29[uVar4 >> 8 & 0xff] ^
          *(uint *)((long)H5 + (ulong)(uVar4 >> 0xe & 0x3fc)) ^ H13[uVar4 >> 0x18] ^ uVar1;
  *(uint *)block = uVar1;
  uVar4 = key[5] + uVar6;
  uVar7 = uVar7 - (H21[uVar4 >> 8 & 0xff] ^ H13[uVar4 & 0xff] ^
                   *(uint *)((long)H29 + (ulong)(uVar4 >> 0xe & 0x3fc)) ^ H5[uVar4 >> 0x18]);
  *(uint *)(block + 4) = uVar7;
  *(uint *)block = uVar1 + uVar6;
  uVar4 = uVar1 + uVar6 + key[6];
  uVar4 = H21[uVar4 & 0xff] ^ H29[uVar4 >> 8 & 0xff] ^
          *(uint *)((long)H5 + (ulong)(uVar4 >> 0xe & 0x3fc)) ^ H13[uVar4 >> 0x18] ^ 6;
  uVar6 = uVar6 + uVar4;
  *(uint *)(block + 0xc) = uVar6;
  uVar1 = uVar1 - uVar4;
  *(uint *)block = uVar1;
  uVar4 = key[7] + uVar1;
  uVar8 = (H21[uVar4 >> 8 & 0xff] ^ H13[uVar4 & 0xff] ^
           *(uint *)((long)H29 + (ulong)(uVar4 >> 0xe & 0x3fc)) ^ H5[uVar4 >> 0x18]) + uVar8;
  *(uint *)(block + 8) = uVar8;
  uVar4 = *key + uVar7;
  uVar6 = H21[uVar4 & 0xff] ^ H29[uVar4 >> 8 & 0xff] ^
          *(uint *)((long)H5 + (ulong)(uVar4 >> 0xe & 0x3fc)) ^ H13[uVar4 >> 0x18] ^ uVar6;
  *(uint *)(block + 0xc) = uVar6;
  uVar4 = key[1] + uVar8;
  uVar1 = H5[uVar4 & 0xff] ^ H13[uVar4 >> 8 & 0xff] ^
          *(uint *)((long)H21 + (ulong)(uVar4 >> 0xe & 0x3fc)) ^ H29[uVar4 >> 0x18] ^ uVar1;
  *(uint *)block = uVar1;
  uVar4 = key[2] + uVar6;
  uVar8 = H5[uVar4 & 0xff] ^ H13[uVar4 >> 8 & 0xff] ^
          *(uint *)((long)H21 + (ulong)(uVar4 >> 0xe & 0x3fc)) ^ H29[uVar4 >> 0x18] ^ uVar8;
  *(uint *)(block + 8) = uVar8;
  uVar4 = key[3] + uVar1;
  uVar7 = H21[uVar4 & 0xff] ^ H29[uVar4 >> 8 & 0xff] ^
          *(uint *)((long)H5 + (ulong)(uVar4 >> 0xe & 0x3fc)) ^ H13[uVar4 >> 0x18] ^ uVar7;
  *(uint *)(block + 4) = uVar7;
  uVar4 = key[4] + uVar8;
  uVar6 = uVar6 - (H21[uVar4 >> 8 & 0xff] ^ H13[uVar4 & 0xff] ^
                   *(uint *)((long)H29 + (ulong)(uVar4 >> 0xe & 0x3fc)) ^ H5[uVar4 >> 0x18]);
  *(uint *)(block + 0xc) = uVar6;
  *(uint *)(block + 4) = uVar7 + uVar8;
  uVar4 = uVar7 + uVar8 + key[5];
  uVar4 = H21[uVar4 & 0xff] ^ H29[uVar4 >> 8 & 0xff] ^
          *(uint *)((long)H5 + (ulong)(uVar4 >> 0xe & 0x3fc)) ^ H13[uVar4 >> 0x18] ^ 7;
  uVar8 = uVar8 + uVar4;
  *(uint *)(block + 8) = uVar8;
  uVar7 = uVar7 - uVar4;
  *(uint *)(block + 4) = uVar7;
  uVar4 = key[6] + uVar7;
  uVar1 = (H21[uVar4 >> 8 & 0xff] ^ H13[uVar4 & 0xff] ^
           *(uint *)((long)H29 + (ulong)(uVar4 >> 0xe & 0x3fc)) ^ H5[uVar4 >> 0x18]) + uVar1;
  *(uint *)block = uVar1;
  uVar4 = key[7] + uVar6;
  uVar8 = H21[uVar4 & 0xff] ^ H29[uVar4 >> 8 & 0xff] ^
          *(uint *)((long)H5 + (ulong)(uVar4 >> 0xe & 0x3fc)) ^ H13[uVar4 >> 0x18] ^ uVar8;
  *(uint *)(block + 8) = uVar8;
  uVar4 = *key + uVar1;
  uVar7 = H5[uVar4 & 0xff] ^ H13[uVar4 >> 8 & 0xff] ^
          *(uint *)((long)H21 + (ulong)(uVar4 >> 0xe & 0x3fc)) ^ H29[uVar4 >> 0x18] ^ uVar7;
  *(uint *)(block + 4) = uVar7;
  uVar4 = key[1] + uVar8;
  uVar1 = H5[uVar4 & 0xff] ^ H13[uVar4 >> 8 & 0xff] ^
          *(uint *)((long)H21 + (ulong)(uVar4 >> 0xe & 0x3fc)) ^ H29[uVar4 >> 0x18] ^ uVar1;
  *(uint *)block = uVar1;
  uVar4 = key[2] + uVar7;
  uVar6 = H21[uVar4 & 0xff] ^ H29[uVar4 >> 8 & 0xff] ^
          *(uint *)((long)H5 + (ulong)(uVar4 >> 0xe & 0x3fc)) ^ H13[uVar4 >> 0x18] ^ uVar6;
  *(uint *)(block + 0xc) = uVar6;
  uVar4 = key[3] + uVar1;
  iVar5 = uVar8 - (H21[uVar4 >> 8 & 0xff] ^ H13[uVar4 & 0xff] ^
                   *(uint *)((long)H29 + (ulong)(uVar4 >> 0xe & 0x3fc)) ^ H5[uVar4 >> 0x18]);
  *(int *)(block + 8) = iVar5;
  *(uint *)(block + 0xc) = uVar6 + uVar1;
  uVar4 = uVar6 + uVar1 + key[4];
  uVar4 = H21[uVar4 & 0xff] ^ H29[uVar4 >> 8 & 0xff] ^
          *(uint *)((long)H5 + (ulong)(uVar4 >> 0xe & 0x3fc)) ^ H13[uVar4 >> 0x18] ^ 8;
  uVar1 = uVar1 + uVar4;
  *(uint *)block = uVar1;
  uVar6 = uVar6 - uVar4;
  *(uint *)(block + 0xc) = uVar6;
  uVar4 = key[5] + uVar6;
  iVar2 = (H21[uVar4 >> 8 & 0xff] ^ H13[uVar4 & 0xff] ^
           *(uint *)((long)H29 + (ulong)(uVar4 >> 0xe & 0x3fc)) ^ H5[uVar4 >> 0x18]) + uVar7;
  *(int *)(block + 4) = iVar2;
  uVar4 = key[6] + iVar5;
  uVar1 = H21[uVar4 & 0xff] ^ H29[uVar4 >> 8 & 0xff] ^
          *(uint *)((long)H5 + (ulong)(uVar4 >> 0xe & 0x3fc)) ^ H13[uVar4 >> 0x18] ^ uVar1;
  *(uint *)block = uVar1;
  uVar3 = key[7] + iVar2;
  uVar4 = H5[uVar3 & 0xff];
  uVar8 = H13[uVar3 >> 8 & 0xff];
  uVar7 = *(uint *)((long)H21 + (ulong)(uVar3 >> 0xe & 0x3fc));
  uVar3 = H29[uVar3 >> 0x18];
  *(int *)block = iVar2;
  *(int *)(block + 0xc) = iVar5;
  *(uint *)(block + 8) = uVar1;
  *(uint *)(block + 4) = uVar4 ^ uVar8 ^ uVar7 ^ uVar3 ^ uVar6;
  return;
}

Assistant:

void beltBlockEncr(octet block[16], const u32 key[8])
{
	u32* t = (u32*)block;
	ASSERT(memIsDisjoint2(block, 16, key, 32));
#if (OCTET_ORDER == BIG_ENDIAN)
	t[0] = u32Rev(t[0]);
	t[1] = u32Rev(t[1]);
	t[2] = u32Rev(t[2]);
	t[3] = u32Rev(t[3]);
#endif
	E((t + 0), (t + 1), (t + 2), (t + 3), key);
#if (OCTET_ORDER == BIG_ENDIAN)
	t[3] = u32Rev(t[3]);
	t[2] = u32Rev(t[2]);
	t[1] = u32Rev(t[1]);
	t[0] = u32Rev(t[0]);
#endif
}